

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_SwapBetweenArenaAndNonArenaUsingReflection_Test::TestBody
          (ArenaTest_SwapBetweenArenaAndNonArenaUsingReflection_Test *this)

{
  TestAllTypes *message;
  Reflection *this_00;
  Reflection *r;
  TestAllTypes *arena2_message;
  Arena arena2;
  undefined1 local_350 [8];
  TestAllTypes non_arena_message;
  ArenaTest_SwapBetweenArenaAndNonArenaUsingReflection_Test *this_local;
  
  non_arena_message.field_0._808_8_ = this;
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_350);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>((TestAllTypes *)local_350);
  Arena::Arena((Arena *)&arena2_message);
  message = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)&arena2_message);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  this_00 = proto2_unittest::TestAllTypes::GetReflection();
  Reflection::Swap(this_00,(Message *)local_350,&message->super_Message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)local_350);
  Arena::~Arena((Arena *)&arena2_message);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_350);
  return;
}

Assistant:

TEST(ArenaTest, SwapBetweenArenaAndNonArenaUsingReflection) {
  TestAllTypes non_arena_message;
  TestUtil::SetAllFields(&non_arena_message);
  {
    Arena arena2;
    TestAllTypes* arena2_message = Arena::Create<TestAllTypes>(&arena2);
    TestUtil::SetAllFields(arena2_message);
    const Reflection* r = arena2_message->GetReflection();
    r->Swap(&non_arena_message, arena2_message);
    TestUtil::ExpectAllFieldsSet(*arena2_message);
    TestUtil::ExpectAllFieldsSet(non_arena_message);
  }
}